

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

void ZSTD_row_fillHashCache
               (ZSTD_matchState_t *ms,BYTE *base,U32 rowLog,U32 mls,U32 idx,BYTE *iLimit)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  U32 UVar5;
  ulong uVar6;
  
  uVar4 = (ulong)idx;
  uVar2 = ((int)iLimit - (int)(base + uVar4)) + 1;
  uVar3 = 8;
  if (uVar2 < 8) {
    uVar3 = uVar2;
  }
  uVar2 = 0;
  if (base + uVar4 <= iLimit) {
    uVar2 = uVar3;
  }
  if (idx < uVar2 + idx) {
    cVar1 = (char)ms->rowHashLog;
    do {
      switch(mls) {
      case 5:
        uVar6 = *(long *)(base + uVar4) * -0x30e4432345000000;
        break;
      case 6:
        uVar6 = *(long *)(base + uVar4) * -0x30e4432340650000;
        break;
      case 7:
        uVar6 = *(long *)(base + uVar4) * -0x30e44323405a9d00;
        break;
      case 8:
        uVar6 = *(long *)(base + uVar4) * -0x30e44323485a9b9d;
        break;
      default:
        UVar5 = (uint)(*(int *)(base + uVar4) * -0x61c8864f) >> (0x18U - cVar1 & 0x1f);
        goto LAB_00735569;
      }
      UVar5 = (U32)(uVar6 >> (0x38U - cVar1 & 0x3f));
LAB_00735569:
      ms->hashCache[(uint)uVar4 & 7] = UVar5;
      uVar4 = uVar4 + 1;
    } while (uVar2 + idx != uVar4);
  }
  return;
}

Assistant:

static void ZSTD_row_fillHashCache(ZSTD_matchState_t* ms, const BYTE* base,
                                   U32 const rowLog, U32 const mls,
                                   U32 idx, const BYTE* const iLimit)
{
    U32 const* const hashTable = ms->hashTable;
    U16 const* const tagTable = ms->tagTable;
    U32 const hashLog = ms->rowHashLog;
    U32 const maxElemsToPrefetch = (base + idx) > iLimit ? 0 : (U32)(iLimit - (base + idx) + 1);
    U32 const lim = idx + MIN(ZSTD_ROW_HASH_CACHE_SIZE, maxElemsToPrefetch);

    for (; idx < lim; ++idx) {
        U32 const hash = (U32)ZSTD_hashPtr(base + idx, hashLog + ZSTD_ROW_HASH_TAG_BITS, mls);
        U32 const row = (hash >> ZSTD_ROW_HASH_TAG_BITS) << rowLog;
        ZSTD_row_prefetch(hashTable, tagTable, row, rowLog);
        ms->hashCache[idx & ZSTD_ROW_HASH_CACHE_MASK] = hash;
    }

    DEBUGLOG(6, "ZSTD_row_fillHashCache(): [%u %u %u %u %u %u %u %u]", ms->hashCache[0], ms->hashCache[1],
                                                     ms->hashCache[2], ms->hashCache[3], ms->hashCache[4],
                                                     ms->hashCache[5], ms->hashCache[6], ms->hashCache[7]);
}